

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::HMMSegment::Cut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  const_iterator in_RDX;
  const_iterator in_RSI;
  HMMSegment *in_RDI;
  WordRange wr;
  const_iterator right;
  const_iterator left;
  const_iterator in_stack_ffffffffffffffc8;
  const_iterator local_28;
  
  local_28 = in_RSI;
  while (in_RSI != in_RDX) {
    if (in_RSI->rune < 0x80) {
      if (local_28 != in_RSI) {
        InternalCut((HMMSegment *)end,(const_iterator)res,left,
                    (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)right);
      }
      local_28 = SequentialLetterRule(in_RDI,in_RSI,in_RDX);
      if ((local_28 == in_RSI) && (local_28 = NumbersRule(in_RDI,in_RSI,in_RDX), local_28 == in_RSI)
         ) {
        local_28 = local_28 + 1;
      }
      WordRange::WordRange((WordRange *)&stack0xffffffffffffffc0,in_RSI,local_28 + -1);
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_28,
                 (value_type *)in_stack_ffffffffffffffc8);
      in_RSI = local_28;
    }
    else {
      in_RSI = in_RSI + 1;
    }
  }
  if (local_28 != in_RSI) {
    InternalCut((HMMSegment *)end,(const_iterator)res,left,
                (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)right);
  }
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res) const {
    RuneStrArray::const_iterator left = begin;
    RuneStrArray::const_iterator right = begin;
    while (right != end) {
      if (right->rune < 0x80) {
        if (left != right) {
          InternalCut(left, right, res);
        }
        left = right;
        do {
          right = SequentialLetterRule(left, end);
          if (right != left) {
            break;
          }
          right = NumbersRule(left, end);
          if (right != left) {
            break;
          }
          right ++;
        } while (false);
        WordRange wr(left, right - 1);
        res.push_back(wr);
        left = right;
      } else {
        right++;
      }
    }
    if (left != right) {
      InternalCut(left, right, res);
    }
  }